

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_list.cpp
# Opt level: O0

Am_Value_List * __thiscall Am_Value_List::operator=(Am_Value_List *this,Am_Value *list_value)

{
  Am_Value_List_Data *this_00;
  Am_ID_Tag AVar1;
  ostream *poVar2;
  Am_Value_List_Data *old_data;
  Am_Value *list_value_local;
  Am_Value_List *this_local;
  
  this_00 = this->data;
  this->data = (Am_Value_List_Data *)list_value->value;
  if (this->data != (Am_Value_List_Data *)0x0) {
    AVar1 = Am_Value_List_Data::Am_Value_List_Data_ID();
    if ((AVar1 != list_value->type) && (list_value->type != 1)) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"** Amulet_Error: ");
      poVar2 = std::operator<<(poVar2,"Tried to set a Am_Value_List with a non list value = ");
      poVar2 = ::operator<<(poVar2,list_value);
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      Am_Error();
    }
    Am_Wrapper::Note_Reference(&this->data->super_Am_Wrapper);
  }
  if (this_00 != (Am_Value_List_Data *)0x0) {
    Am_Wrapper::Release(&this_00->super_Am_Wrapper);
  }
  this->item = (Am_List_Item *)0x0;
  return this;
}

Assistant:

Am_Value_List &
Am_Value_List::operator=(const Am_Value &list_value)
{
  Am_Value_List_Data *old_data = data;
  data = (Am_Value_List_Data *)list_value.value.wrapper_value;
  if (data) {
    if (Am_Value_List_Data::Am_Value_List_Data_ID() != list_value.type &&
        list_value.type != Am_ZERO) {
      Am_ERROR("Tried to set a Am_Value_List with a non list value = "
               << list_value);
    }
    data->Note_Reference();
  }
  if (old_data)
    old_data->Release();
  item = nullptr;
  return *this;
}